

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TreePushRawID(ImGuiID id)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  uint *__src;
  int iVar3;
  uint *__dest;
  int iVar4;
  int iVar5;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  Indent(0.0);
  piVar1 = &(pIVar2->DC).TreeDepth;
  *piVar1 = *piVar1 + 1;
  iVar3 = (pIVar2->IDStack).Size;
  if (iVar3 == (pIVar2->IDStack).Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar5 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    __dest = (uint *)MemAlloc((long)iVar5 << 2);
    __src = (pIVar2->IDStack).Data;
    if (__src != (uint *)0x0) {
      memcpy(__dest,__src,(long)(pIVar2->IDStack).Size << 2);
      MemFree((pIVar2->IDStack).Data);
    }
    (pIVar2->IDStack).Data = __dest;
    (pIVar2->IDStack).Capacity = iVar5;
    iVar3 = (pIVar2->IDStack).Size;
  }
  else {
    __dest = (pIVar2->IDStack).Data;
  }
  __dest[iVar3] = id;
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::TreePushRawID(ImGuiID id)
{
    ImGuiWindow* window = GetCurrentWindow();
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}